

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O1

db_bit * __thiscall lan::db::find(db *this,string *name,db_bit *ref)

{
  size_t sVar1;
  size_t __n;
  int iVar2;
  out_of_range *this_00;
  db_bit *pdVar3;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  iVar2 = std::__cxx11::string::compare((char *)name);
  if (iVar2 == 0) {
    pdVar3 = this->anchor;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)name);
    if (iVar2 == 0) {
      this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
      local_48[0] = local_38;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"");
      local_68[0] = local_58;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_68,
                 "LANDB (empty_anchor_error): Using empty anchor, catch to continue.","");
      std::out_of_range::out_of_range(this_00,(string *)local_68);
      __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    if (ref != (db_bit *)0x0) {
      sVar1 = name->_M_string_length;
      do {
        __n = (ref->key)._M_string_length;
        if (__n == sVar1) {
          if (__n == 0) {
            return ref;
          }
          iVar2 = bcmp((ref->key)._M_dataplus._M_p,(name->_M_dataplus)._M_p,__n);
          if (iVar2 == 0) {
            return ref;
          }
        }
        ref = ref->nex;
      } while (ref != (db_bit *)0x0);
    }
    pdVar3 = (db_bit *)0x0;
  }
  return pdVar3;
}

Assistant:

lan::db_bit * db::find(const std::string name, lan::db_bit * ref){
            lan::db_bit * buf = ref;
            if(name == "@") return anchor;
            else if(name == "@") throw lan::errors::anchor_name_error(error_string(errors::_private::_empty_anchor_error, ""));
            while (buf) {
                if(buf->key == name) return buf;
                buf = buf->nex;
            } return nullptr;
        }